

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Optional<unsigned_long> __thiscall llvm::DWARFDebugNames::Entry::getCUIndex(Entry *this)

{
  undefined1 auVar1 [16];
  DWARFFormValue *this_00;
  undefined8 extraout_RDX;
  OptionalStorage<unsigned_long,_true> OVar2;
  undefined1 local_50 [8];
  Optional<llvm::DWARFFormValue> Off;
  
  lookup((Optional<llvm::DWARFFormValue> *)local_50,this,DW_IDX_compile_unit);
  if (Off.Storage.field_0._40_1_ == '\x01') {
    this_00 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                        ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_50);
    OVar2 = (OptionalStorage<unsigned_long,_true>)DWARFFormValue::getAsUnsignedConstant(this_00);
  }
  else {
    auVar1._1_7_ = (int7)((ulong)extraout_RDX >> 8);
    auVar1[0] = (this->NameIdx->Hdr).super_HeaderPOD.CompUnitCount == 1;
    auVar1._8_8_ = 0;
    OVar2 = (OptionalStorage<unsigned_long,_true>)(auVar1 << 0x40);
  }
  return (Optional<unsigned_long>)OVar2;
}

Assistant:

Optional<uint64_t> DWARFDebugNames::Entry::getCUIndex() const {
  if (Optional<DWARFFormValue> Off = lookup(dwarf::DW_IDX_compile_unit))
    return Off->getAsUnsignedConstant();
  // In a per-CU index, the entries without a DW_IDX_compile_unit attribute
  // implicitly refer to the single CU.
  if (NameIdx->getCUCount() == 1)
    return 0;
  return None;
}